

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Log::~Log(Log *this)

{
  Log *this_local;
  
  ~Log(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Log	(void) : LogFunc("log", deLog) {}